

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  ZSTD_matchState_t *pZVar4;
  seqStore_t *psVar5;
  U32 lowestValid;
  ulong *puVar6;
  seqDef *psVar7;
  ulong *puVar8;
  long lVar9;
  BYTE *litEnd_1;
  ulong *puVar10;
  uint uVar11;
  long lVar12;
  ulong *puVar13;
  ulong uVar14;
  uint uVar15;
  ulong *puVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  BYTE *litEnd;
  ulong *puVar20;
  BYTE *pBVar21;
  ulong uVar22;
  ulong uVar23;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  uint local_bc;
  size_t local_b8;
  ZSTD_matchState_t *local_b0;
  uint local_a4;
  ulong *local_a0;
  ulong *local_98;
  uint local_8c;
  ulong *local_88;
  ulong *local_80;
  seqStore_t *local_78;
  ulong *local_70;
  ulong *local_68;
  ulong *local_60;
  long local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  BYTE *local_40;
  uint *local_38;
  
  puVar20 = (ulong *)((long)src + srcSize);
  pBVar21 = (ms->window).base;
  uVar19 = (ms->window).dictLimit;
  local_40 = pBVar21 + uVar19;
  uVar15 = (ms->cParams).minMatch;
  uVar11 = 6;
  if (uVar15 < 6) {
    uVar11 = uVar15;
  }
  local_a4 = 4;
  if (4 < uVar11) {
    local_a4 = uVar11;
  }
  local_44 = *rep;
  puVar10 = (ulong *)((ulong)((int)src == (int)local_40) + (long)src);
  iVar17 = (int)puVar10 - (int)pBVar21;
  uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_48 = iVar17 - uVar15;
  if (iVar17 - uVar19 <= uVar15) {
    local_48 = uVar19;
  }
  if (ms->loadedDictEnd != 0) {
    local_48 = uVar19;
  }
  local_4c = rep[1];
  local_48 = iVar17 - local_48;
  uVar19 = local_4c;
  if (local_48 < local_4c) {
    uVar19 = 0;
  }
  uVar22 = (ulong)uVar19;
  local_bc = local_44;
  if (local_48 < local_44) {
    local_bc = 0;
  }
  local_80 = (ulong *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  local_38 = rep;
  if (puVar10 < local_80) {
    puVar16 = (ulong *)((long)puVar20 + -7);
    local_60 = (ulong *)((long)puVar20 + -3);
    local_68 = (ulong *)((long)puVar20 + -1);
    local_70 = puVar20 + -4;
    local_b0 = ms;
    local_98 = puVar16;
    local_88 = puVar20;
    local_78 = seqStore;
    do {
      local_8c = (uint)uVar22;
      local_a0 = (ulong *)((long)puVar10 + 1);
      local_58 = -(ulong)local_bc;
      if (local_bc == 0) {
        uVar22 = 0;
      }
      else {
        uVar22 = 0;
        if (*(int *)((long)local_a0 - (ulong)local_bc) == *(int *)((long)puVar10 + 1)) {
          puVar6 = (ulong *)((long)puVar10 + 5);
          puVar8 = (ulong *)((long)puVar10 + local_58 + 5);
          puVar13 = puVar6;
          if (puVar6 < puVar16) {
            if (*puVar8 == *puVar6) {
              lVar9 = 0;
              do {
                puVar13 = (ulong *)((long)puVar10 + lVar9 + 0xd);
                if (puVar16 <= puVar13) {
                  puVar8 = (ulong *)((long)puVar10 + local_58 + lVar9 + 0xd);
                  puVar13 = (ulong *)((long)puVar10 + lVar9 + 0xd);
                  goto LAB_01d34829;
                }
                uVar22 = *(ulong *)((long)puVar10 + lVar9 + local_58 + 0xd);
                uVar14 = *puVar13;
                lVar9 = lVar9 + 8;
              } while (uVar22 == uVar14);
              uVar14 = uVar14 ^ uVar22;
              uVar22 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar22 = (uVar22 >> 3 & 0x1fffffff) + lVar9;
            }
            else {
              uVar14 = *puVar6 ^ *puVar8;
              uVar22 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar22 = uVar22 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_01d34829:
            if ((puVar13 < local_60) && ((int)*puVar8 == (int)*puVar13)) {
              puVar13 = (ulong *)((long)puVar13 + 4);
              puVar8 = (ulong *)((long)puVar8 + 4);
            }
            if ((puVar13 < local_68) && ((short)*puVar8 == (short)*puVar13)) {
              puVar13 = (ulong *)((long)puVar13 + 2);
              puVar8 = (ulong *)((long)puVar8 + 2);
            }
            if (puVar13 < puVar20) {
              puVar13 = (ulong *)((long)puVar13 + (ulong)((BYTE)*puVar8 == (BYTE)*puVar13));
            }
            uVar22 = (long)puVar13 - (long)puVar6;
          }
          uVar22 = uVar22 + 4;
        }
      }
      local_b8 = 999999999;
      if (local_a4 == 6) {
        uVar14 = ZSTD_BtFindBestMatch_noDict_6(local_b0,(BYTE *)puVar10,(BYTE *)puVar20,&local_b8);
      }
      else if (local_a4 == 5) {
        uVar14 = ZSTD_BtFindBestMatch_noDict_5(local_b0,(BYTE *)puVar10,(BYTE *)puVar20,&local_b8);
      }
      else {
        uVar14 = ZSTD_BtFindBestMatch_noDict_4(local_b0,(BYTE *)puVar10,(BYTE *)puVar20,&local_b8);
      }
      uVar18 = uVar22;
      if (uVar22 < uVar14) {
        uVar18 = uVar14;
      }
      if (uVar18 < 4) {
        local_b0->lazySkipping = (uint)(0x7ff < (ulong)((long)puVar10 - (long)src));
        puVar16 = local_98;
        puVar10 = (ulong *)((long)puVar10 + ((ulong)((long)puVar10 - (long)src) >> 8) + 1);
        uVar22 = (ulong)local_8c;
      }
      else {
        puVar20 = puVar10;
        uVar23 = local_b8;
        if (uVar14 <= uVar22) {
          puVar20 = local_a0;
          uVar23 = 1;
        }
        local_a0 = puVar20;
        if (puVar10 < local_80) {
          do {
            puVar20 = (ulong *)((long)puVar10 + 1);
            if (uVar23 == 0) {
              uVar23 = 0;
            }
            else if ((local_bc != 0) && (*(int *)puVar20 == *(int *)((long)puVar20 + local_58))) {
              puVar16 = (ulong *)((long)puVar10 + 5);
              puVar13 = (ulong *)((long)puVar10 + local_58 + 5);
              puVar6 = puVar16;
              if (puVar16 < local_98) {
                if (*puVar13 == *puVar16) {
                  puVar6 = (ulong *)((long)puVar10 + 0xd);
                  do {
                    if (local_98 <= puVar6) {
                      puVar13 = (ulong *)((long)puVar6 + local_58);
                      goto LAB_01d349f7;
                    }
                    puVar13 = (ulong *)((long)puVar6 + local_58);
                    uVar22 = *puVar6;
                    puVar6 = puVar6 + 1;
                  } while (*puVar13 == uVar22);
                  uVar22 = uVar22 ^ *puVar13;
                  uVar14 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                    }
                  }
                  puVar6 = (ulong *)((long)puVar6 + ((uVar14 >> 3 & 0x1fffffff) - 8));
                  goto LAB_01d34a37;
                }
                uVar14 = *puVar16 ^ *puVar13;
                uVar22 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
              }
              else {
LAB_01d349f7:
                if ((puVar6 < local_60) && ((int)*puVar13 == (int)*puVar6)) {
                  puVar6 = (ulong *)((long)puVar6 + 4);
                  puVar13 = (ulong *)((long)puVar13 + 4);
                }
                if ((puVar6 < local_68) && ((short)*puVar13 == (short)*puVar6)) {
                  puVar6 = (ulong *)((long)puVar6 + 2);
                  puVar13 = (ulong *)((long)puVar13 + 2);
                }
                if (puVar6 < local_88) {
                  puVar6 = (ulong *)((long)puVar6 + (ulong)((BYTE)*puVar13 == (BYTE)*puVar6));
                }
LAB_01d34a37:
                uVar22 = (long)puVar6 - (long)puVar16;
                if (0xfffffffffffffffb < uVar22) goto LAB_01d34a69;
              }
              uVar19 = 0x1f;
              if ((uint)uVar23 != 0) {
                for (; (uint)uVar23 >> uVar19 == 0; uVar19 = uVar19 - 1) {
                }
              }
              if ((int)((uVar19 ^ 0x1f) + (int)uVar18 * 3 + -0x1e) < (int)(uVar22 + 4) * 3) {
                uVar23 = 1;
                uVar18 = uVar22 + 4;
                local_a0 = puVar20;
              }
            }
LAB_01d34a69:
            local_b8 = 999999999;
            if (local_a4 == 6) {
              uVar22 = ZSTD_BtFindBestMatch_noDict_6
                                 (local_b0,(BYTE *)puVar20,(BYTE *)local_88,&local_b8);
            }
            else if (local_a4 == 5) {
              uVar22 = ZSTD_BtFindBestMatch_noDict_5
                                 (local_b0,(BYTE *)puVar20,(BYTE *)local_88,&local_b8);
            }
            else {
              uVar22 = ZSTD_BtFindBestMatch_noDict_4
                                 (local_b0,(BYTE *)puVar20,(BYTE *)local_88,&local_b8);
            }
            uVar19 = (uint)uVar23;
            if (uVar22 < 4) {
LAB_01d34af5:
              if (local_80 <= puVar20) break;
              puVar20 = (ulong *)((long)puVar10 + 2);
              if (uVar23 == 0) {
                uVar23 = 0;
              }
              else if ((local_bc != 0) && (*(int *)puVar20 == *(int *)((long)puVar20 + local_58))) {
                puVar16 = (ulong *)((long)puVar10 + 6);
                puVar6 = (ulong *)((long)puVar10 + local_58 + 6);
                puVar13 = puVar16;
                if (puVar16 < local_98) {
                  if (*puVar6 == *puVar16) {
                    puVar13 = (ulong *)((long)puVar10 + 0xe);
                    do {
                      if (local_98 <= puVar13) {
                        puVar6 = (ulong *)(local_58 + (long)puVar13);
                        goto LAB_01d34ba1;
                      }
                      puVar10 = (ulong *)((long)puVar13 + local_58);
                      uVar22 = *puVar13;
                      puVar13 = puVar13 + 1;
                    } while (*puVar10 == uVar22);
                    uVar22 = uVar22 ^ *puVar10;
                    uVar14 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                      }
                    }
                    puVar13 = (ulong *)((long)puVar13 + ((uVar14 >> 3 & 0x1fffffff) - 8));
                    goto LAB_01d34be2;
                  }
                  uVar14 = *puVar16 ^ *puVar6;
                  uVar22 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = uVar22 >> 3 & 0x1fffffff;
                }
                else {
LAB_01d34ba1:
                  if ((puVar13 < local_60) && ((int)*puVar6 == (int)*puVar13)) {
                    puVar13 = (ulong *)((long)puVar13 + 4);
                    puVar6 = (ulong *)((long)puVar6 + 4);
                  }
                  if ((puVar13 < local_68) && ((short)*puVar6 == (short)*puVar13)) {
                    puVar13 = (ulong *)((long)puVar13 + 2);
                    puVar6 = (ulong *)((long)puVar6 + 2);
                  }
                  if (puVar13 < local_88) {
                    puVar13 = (ulong *)((long)puVar13 + (ulong)((BYTE)*puVar6 == (BYTE)*puVar13));
                  }
LAB_01d34be2:
                  uVar22 = (long)puVar13 - (long)puVar16;
                  if (0xfffffffffffffffb < uVar22) goto LAB_01d34c16;
                }
                uVar15 = 0x1f;
                if (uVar19 != 0) {
                  for (; uVar19 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                  }
                }
                if ((int)((uVar15 ^ 0x1f) + (int)uVar18 * 4 + -0x1e) < (int)(uVar22 + 4) * 4) {
                  uVar23 = 1;
                  uVar18 = uVar22 + 4;
                  local_a0 = puVar20;
                }
              }
LAB_01d34c16:
              local_b8 = 999999999;
              if (local_a4 == 6) {
                uVar22 = ZSTD_BtFindBestMatch_noDict_6
                                   (local_b0,(BYTE *)puVar20,(BYTE *)local_88,&local_b8);
              }
              else if (local_a4 == 5) {
                uVar22 = ZSTD_BtFindBestMatch_noDict_5
                                   (local_b0,(BYTE *)puVar20,(BYTE *)local_88,&local_b8);
              }
              else {
                uVar22 = ZSTD_BtFindBestMatch_noDict_4
                                   (local_b0,(BYTE *)puVar20,(BYTE *)local_88,&local_b8);
              }
              if (uVar22 < 4) break;
              uVar19 = 0x1f;
              if ((uint)uVar23 != 0) {
                for (; (uint)uVar23 >> uVar19 == 0; uVar19 = uVar19 - 1) {
                }
              }
              iVar17 = 0x1f;
              if ((uint)local_b8 != 0) {
                for (; (uint)local_b8 >> iVar17 == 0; iVar17 = iVar17 + -1) {
                }
              }
              if ((int)uVar22 * 4 - iVar17 <= (int)((uVar19 ^ 0x1f) + (int)uVar18 * 4 + -0x18))
              break;
            }
            else {
              uVar15 = 0x1f;
              if (uVar19 != 0) {
                for (; uVar19 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                }
              }
              iVar17 = 0x1f;
              if ((uint)local_b8 != 0) {
                for (; (uint)local_b8 >> iVar17 == 0; iVar17 = iVar17 + -1) {
                }
              }
              if ((int)uVar22 * 4 - iVar17 <= (int)((uVar15 ^ 0x1f) + (int)uVar18 * 4 + -0x1b))
              goto LAB_01d34af5;
            }
            puVar10 = puVar20;
            uVar18 = uVar22;
            uVar23 = local_b8;
            local_a0 = puVar10;
          } while (puVar10 < local_80);
        }
        pZVar4 = local_b0;
        puVar10 = local_a0;
        uVar19 = local_bc;
        if (3 < uVar23) {
          if ((src < local_a0) && (local_40 < (BYTE *)((long)local_a0 + (3 - uVar23)))) {
            puVar20 = local_a0;
            while (puVar10 = puVar20,
                  *(BYTE *)((long)puVar20 + -1) == *(BYTE *)((long)puVar20 + (2 - uVar23))) {
              puVar10 = (ulong *)((long)puVar20 + -1);
              uVar18 = uVar18 + 1;
              if ((puVar10 <= src) ||
                 (pBVar21 = (BYTE *)((long)puVar20 + (2 - uVar23)), puVar20 = puVar10,
                 pBVar21 <= local_40)) break;
            }
          }
          uVar19 = (U32)uVar23 - 3;
          local_8c = local_bc;
        }
        local_bc = uVar19;
        uVar22 = (long)puVar10 - (long)src;
        puVar20 = (ulong *)local_78->lit;
        if (local_70 < puVar10) {
          ZSTD_safecopyLiterals((BYTE *)puVar20,(BYTE *)src,(BYTE *)puVar10,(BYTE *)local_70);
LAB_01d34d73:
          local_78->lit = local_78->lit + uVar22;
          psVar7 = local_78->sequences;
          if (0xffff < uVar22) {
            local_78->longLengthType = ZSTD_llt_literalLength;
            local_78->longLengthPos =
                 (U32)((ulong)((long)psVar7 - (long)local_78->sequencesStart) >> 3);
          }
        }
        else {
          uVar14 = *(ulong *)((long)src + 8);
          *puVar20 = *src;
          puVar20[1] = uVar14;
          pBVar21 = local_78->lit;
          if (0x10 < uVar22) {
            uVar14 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar21 + 0x18) = uVar14;
            if (0x20 < (long)uVar22) {
              lVar9 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar9 + 0x20);
                uVar3 = puVar2[1];
                pBVar1 = pBVar21 + lVar9 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar3;
                puVar2 = (undefined8 *)((long)src + lVar9 + 0x30);
                uVar3 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar3;
                lVar9 = lVar9 + 0x20;
              } while (pBVar1 + 0x20 < pBVar21 + uVar22);
            }
            goto LAB_01d34d73;
          }
          local_78->lit = pBVar21 + uVar22;
          psVar7 = local_78->sequences;
        }
        psVar5 = local_78;
        puVar20 = local_88;
        psVar7->litLength = (U16)uVar22;
        psVar7->offBase = (U32)uVar23;
        if (0xffff < uVar18 - 3) {
          local_78->longLengthType = ZSTD_llt_matchLength;
          local_78->longLengthPos =
               (U32)((ulong)((long)psVar7 - (long)local_78->sequencesStart) >> 3);
        }
        psVar7->mlBase = (U16)(uVar18 - 3);
        local_78->sequences = psVar7 + 1;
        uVar14 = (ulong)local_8c;
        if (pZVar4->lazySkipping != 0) {
          pZVar4->lazySkipping = 0;
        }
        src = (void *)((long)puVar10 + uVar18);
        puVar16 = local_98;
        puVar10 = (ulong *)src;
        uVar22 = uVar14;
        if ((local_8c != 0) && (src <= local_80)) {
          do {
            uVar19 = (uint)uVar14;
            puVar10 = (ulong *)src;
            uVar22 = uVar14;
            if ((int)*src != *(int *)((long)src - uVar14)) break;
            lVar9 = -uVar14;
            puVar10 = (ulong *)((long)src + 4);
            puVar13 = (ulong *)((long)src + lVar9 + 4);
            puVar6 = puVar10;
            if (puVar10 < puVar16) {
              if (*puVar13 == *puVar10) {
                lVar12 = 0;
                do {
                  puVar6 = (ulong *)((long)src + lVar12 + 0xc);
                  if (puVar16 <= puVar6) {
                    puVar13 = (ulong *)((long)src + lVar9 + lVar12 + 0xc);
                    puVar6 = (ulong *)((long)src + lVar12 + 0xc);
                    goto LAB_01d34f12;
                  }
                  uVar22 = *(ulong *)((long)src + lVar12 + lVar9 + 0xc);
                  uVar14 = *puVar6;
                  lVar12 = lVar12 + 8;
                } while (uVar22 == uVar14);
                uVar14 = uVar14 ^ uVar22;
                uVar22 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = (uVar22 >> 3 & 0x1fffffff) + lVar12;
              }
              else {
                uVar14 = *puVar10 ^ *puVar13;
                uVar22 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_01d34f12:
              if ((puVar6 < local_60) && ((int)*puVar13 == (int)*puVar6)) {
                puVar6 = (ulong *)((long)puVar6 + 4);
                puVar13 = (ulong *)((long)puVar13 + 4);
              }
              if ((puVar6 < local_68) && ((short)*puVar13 == (short)*puVar6)) {
                puVar6 = (ulong *)((long)puVar6 + 2);
                puVar13 = (ulong *)((long)puVar13 + 2);
              }
              if (puVar6 < puVar20) {
                puVar6 = (ulong *)((long)puVar6 + (ulong)((BYTE)*puVar13 == (BYTE)*puVar6));
              }
              uVar22 = (long)puVar6 - (long)puVar10;
            }
            puVar10 = (ulong *)psVar5->lit;
            if (local_70 < src) {
              ZSTD_safecopyLiterals((BYTE *)puVar10,(BYTE *)src,(BYTE *)src,(BYTE *)local_70);
              puVar16 = local_98;
            }
            else {
              uVar14 = *(ulong *)((long)src + 8);
              *puVar10 = *src;
              puVar10[1] = uVar14;
            }
            psVar7 = psVar5->sequences;
            psVar7->litLength = 0;
            psVar7->offBase = 1;
            if (0xffff < uVar22 + 1) {
              psVar5->longLengthType = ZSTD_llt_matchLength;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar7 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar7->mlBase = (U16)(uVar22 + 1);
            psVar5->sequences = psVar7 + 1;
            src = (void *)((long)src + uVar22 + 4);
            puVar10 = (ulong *)src;
            if (local_bc == 0) {
              uVar22 = 0;
              local_bc = uVar19;
              break;
            }
            uVar14 = (ulong)local_bc;
            uVar22 = (ulong)local_bc;
            local_bc = uVar19;
          } while (src <= local_80);
        }
      }
      uVar19 = (uint)uVar22;
    } while (puVar10 < local_80);
  }
  if (local_4c <= local_48) {
    local_4c = 0;
  }
  uVar15 = local_4c;
  if (local_bc != 0) {
    uVar15 = local_44;
  }
  if (local_44 <= local_48) {
    uVar15 = local_4c;
    local_44 = 0;
  }
  if (local_bc != 0) {
    local_44 = local_bc;
  }
  if (uVar19 != 0) {
    uVar15 = uVar19;
  }
  *local_38 = local_44;
  local_38[1] = uVar15;
  return (long)puVar20 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_noDict);
}